

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O2

string * __thiscall
rlib::JsonT<void>::stringify_abi_cxx11_(string *__return_storage_ptr__,JsonT<void> *this)

{
  Format FStack_78;
  
  Stringify::Format::Format(&FStack_78);
  stringify_abi_cxx11_(__return_storage_ptr__,this,&FStack_78);
  Stringify::Format::~Format(&FStack_78);
  return __return_storage_ptr__;
}

Assistant:

std::string stringify() const {
			return stringify(typename Stringify::Format());
		}